

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btJacobianEntry.h
# Opt level: O2

btScalar __thiscall
btJacobianEntry::getRelativeVelocity
          (btJacobianEntry *this,btVector3 *linvelA,btVector3 *angvelA,btVector3 *linvelB,
          btVector3 *angvelB)

{
  undefined8 uVar1;
  btVector3 bVar2;
  btVector3 bVar3;
  btVector3 bVar4;
  float local_58;
  float local_48;
  float local_38;
  float fStack_34;
  float local_28;
  float fStack_24;
  
  bVar2 = operator-(linvelA,linvelB);
  bVar3 = operator*(angvelA,&this->m_aJ);
  bVar4 = operator*(angvelB,&this->m_bJ);
  local_48 = bVar2.m_floats[2];
  local_58 = bVar3.m_floats[2];
  uVar1 = *(undefined8 *)(this->m_linearJointAxis).m_floats;
  local_28 = bVar2.m_floats[0];
  fStack_24 = bVar2.m_floats[1];
  local_38 = bVar3.m_floats[0];
  fStack_34 = bVar3.m_floats[1];
  return bVar4.m_floats[0] + local_38 + (float)uVar1 * local_28 +
         bVar4.m_floats[1] + fStack_34 + (float)((ulong)uVar1 >> 0x20) * fStack_24 +
         local_58 + bVar4.m_floats[2] + local_48 * (this->m_linearJointAxis).m_floats[2] +
         1.1920929e-07;
}

Assistant:

btScalar getRelativeVelocity(const btVector3& linvelA,const btVector3& angvelA,const btVector3& linvelB,const btVector3& angvelB)
	{
		btVector3 linrel = linvelA - linvelB;
		btVector3 angvela  = angvelA * m_aJ;
		btVector3 angvelb  = angvelB * m_bJ;
		linrel *= m_linearJointAxis;
		angvela += angvelb;
		angvela += linrel;
		btScalar rel_vel2 = angvela[0]+angvela[1]+angvela[2];
		return rel_vel2 + SIMD_EPSILON;
	}